

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

bool __thiscall
llvm::DWARFDebugLine::Prologue::getFileNameByIndex
          (Prologue *this,uint64_t FileIndex,StringRef CompDir,FileLineInfoKind Kind,string *Result,
          Style Style)

{
  ulong uVar1;
  pointer pDVar2;
  bool bVar3;
  FileNameEntry *this_00;
  char **ppcVar4;
  Optional<const_char_*> OVar5;
  Twine local_f0;
  Twine local_d8;
  undefined1 local_c0 [8];
  StringRef CompDir_local;
  StringRef FileName;
  Child local_88;
  SmallString<16U> FilePath;
  StringRef IncludeDir;
  Child local_50 [4];
  
  local_c0 = (undefined1  [8])CompDir.Data;
  if ((Kind != None) &&
     (CompDir_local.Data = (char *)CompDir.Length, bVar3 = hasFileAtIndex(this,FileIndex), bVar3)) {
    this_00 = getFileNameEntry(this,FileIndex);
    OVar5 = DWARFFormValue::getAsCString(&this_00->Name);
    local_88 = (Child)OVar5.Storage.field_0;
    FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX =
         (void *)CONCAT71(FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                          super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX.
                          _1_7_,OVar5.Storage.hasVal);
    ppcVar4 = optional_detail::OptionalStorage<const_char_*,_true>::getValue
                        ((OptionalStorage<const_char_*,_true> *)&local_88);
    StringRef::StringRef((StringRef *)&CompDir_local.Length,*ppcVar4);
    if (Kind == AbsoluteFilePath) {
      Twine::Twine((Twine *)&local_88,(StringRef *)&CompDir_local.Length);
      bVar3 = isPathAbsoluteOnWindowsOrPosix((Twine *)&local_88);
      if (!bVar3) {
        local_88 = (Child)&FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.BeginX = (void *)0x1000000000;
        FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[8].
        buffer[0] = (char  [1])0x0;
        FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[9].
        buffer[0] = (char  [1])0x0;
        FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[10].
        buffer[0] = (char  [1])0x0;
        FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[0xb].
        buffer[0] = (char  [1])0x0;
        FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[0xc].
        buffer[0] = (char  [1])0x0;
        FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[0xd].
        buffer[0] = (char  [1])0x0;
        FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[0xe].
        buffer[0] = (char  [1])0x0;
        FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[0xf].
        buffer[0] = (char  [1])0x0;
        uVar1 = this_00->DirIdx;
        if ((this->FormParams).Version < 5) {
          if ((uVar1 != 0) &&
             (pDVar2 = (this->IncludeDirectories).
                       super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             uVar1 <= (ulong)(((long)(this->IncludeDirectories).
                                     super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2) /
                             0x30))) {
            OVar5 = DWARFFormValue::getAsCString(pDVar2 + (uVar1 - 1));
            FileName.Length = (size_t)OVar5.Storage.field_0;
            ppcVar4 = optional_detail::OptionalStorage<const_char_*,_true>::getValue
                                ((OptionalStorage<const_char_*,_true> *)&FileName.Length);
            StringRef::StringRef((StringRef *)local_50,*ppcVar4);
            FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts.
            _8_8_ = local_50[0];
          }
          if ((char *)CompDir.Length != (char *)0x0) {
            Twine::Twine((Twine *)local_50,
                         (StringRef *)
                         (FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                          InlineElts + 8));
            bVar3 = isPathAbsoluteOnWindowsOrPosix((Twine *)local_50);
            if (!bVar3) {
              Twine::Twine((Twine *)local_50,(StringRef *)local_c0);
              Twine::Twine((Twine *)&FileName.Length,"");
              Twine::Twine(&local_f0,"");
              Twine::Twine(&local_d8,"");
              sys::path::append((SmallVectorImpl<char> *)&local_88,Style,(Twine *)local_50,
                                (Twine *)&FileName.Length,&local_f0,&local_d8);
            }
          }
        }
        else {
          pDVar2 = (this->IncludeDirectories).
                   super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (uVar1 < (ulong)(((long)(this->IncludeDirectories).
                                     super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2) /
                             0x30)) {
            OVar5 = DWARFFormValue::getAsCString(pDVar2 + uVar1);
            FileName.Length = (size_t)OVar5.Storage.field_0;
            ppcVar4 = optional_detail::OptionalStorage<const_char_*,_true>::getValue
                                ((OptionalStorage<const_char_*,_true> *)&FileName.Length);
            StringRef::StringRef((StringRef *)local_50,*ppcVar4);
            FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts.
            _8_8_ = local_50[0];
          }
        }
        Twine::Twine((Twine *)local_50,
                     (StringRef *)
                     (FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                      InlineElts + 8));
        Twine::Twine((Twine *)&FileName.Length,(StringRef *)&CompDir_local.Length);
        Twine::Twine(&local_f0,"");
        Twine::Twine(&local_d8,"");
        sys::path::append((SmallVectorImpl<char> *)&local_88,Style,(Twine *)local_50,
                          (Twine *)&FileName.Length,&local_f0,&local_d8);
        FileName.Length = (size_t)local_88;
        StringRef::str_abi_cxx11_((string *)local_50,(StringRef *)&FileName.Length);
        std::__cxx11::string::operator=((string *)Result,(string *)&local_50[0].character);
        std::__cxx11::string::~string((string *)&local_50[0].character);
        SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&local_88);
        return true;
      }
    }
    StringRef::str_abi_cxx11_((string *)&local_88,(StringRef *)&CompDir_local.Length);
    std::__cxx11::string::operator=((string *)Result,(string *)&local_88.character);
    std::__cxx11::string::~string((string *)&local_88.character);
    return true;
  }
  return false;
}

Assistant:

bool DWARFDebugLine::Prologue::getFileNameByIndex(
    uint64_t FileIndex, StringRef CompDir, FileLineInfoKind Kind,
    std::string &Result, sys::path::Style Style) const {
  if (Kind == FileLineInfoKind::None || !hasFileAtIndex(FileIndex))
    return false;
  const FileNameEntry &Entry = getFileNameEntry(FileIndex);
  StringRef FileName = Entry.Name.getAsCString().getValue();
  if (Kind != FileLineInfoKind::AbsoluteFilePath ||
      isPathAbsoluteOnWindowsOrPosix(FileName)) {
    Result = FileName;
    return true;
  }

  SmallString<16> FilePath;
  StringRef IncludeDir;
  // Be defensive about the contents of Entry.
  if (getVersion() >= 5) {
    if (Entry.DirIdx < IncludeDirectories.size())
      IncludeDir = IncludeDirectories[Entry.DirIdx].getAsCString().getValue();
  } else {
    if (0 < Entry.DirIdx && Entry.DirIdx <= IncludeDirectories.size())
      IncludeDir =
          IncludeDirectories[Entry.DirIdx - 1].getAsCString().getValue();

    // We may still need to append compilation directory of compile unit.
    // We know that FileName is not absolute, the only way to have an
    // absolute path at this point would be if IncludeDir is absolute.
    if (!CompDir.empty() && !isPathAbsoluteOnWindowsOrPosix(IncludeDir))
      sys::path::append(FilePath, Style, CompDir);
  }

  // sys::path::append skips empty strings.
  sys::path::append(FilePath, Style, IncludeDir, FileName);
  Result = FilePath.str();
  return true;
}